

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

JoinNode * __thiscall GraphBuilder::addNode<JoinNode>(GraphBuilder *this,JoinNode *node)

{
  bool bVar1;
  __ireturn_type _Var2;
  JoinNode *local_28;
  JoinNode *local_20;
  
  local_28 = node;
  local_20 = (JoinNode *)Node::callInstruction(&node->super_Node);
  std::
  _Hashtable<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,JoinNode*>,std::allocator<std::pair<llvm::CallInst_const*const,JoinNode*>>,std::__detail::_Select1st,std::equal_to<llvm::CallInst_const*>,std::hash<llvm::CallInst_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<llvm::CallInst_const*,JoinNode*&>
            ((_Hashtable<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,JoinNode*>,std::allocator<std::pair<llvm::CallInst_const*const,JoinNode*>>,std::__detail::_Select1st,std::equal_to<llvm::CallInst_const*>,std::hash<llvm::CallInst_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->llvmToJoins_,&local_20,&local_28);
  bVar1 = Node::isArtificial(&local_28->super_Node);
  if (bVar1) {
    local_20 = local_28;
    _Var2 = std::__detail::
            _Insert<Node_*,_Node_*,_std::allocator<Node_*>,_std::__detail::_Identity,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            ::insert((_Insert<Node_*,_Node_*,_std::allocator<Node_*>,_std::__detail::_Identity,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)&this->artificialNodes_,(value_type *)&local_20);
  }
  else {
    local_20 = (JoinNode *)Node::llvmInstruction(&local_28->super_Node);
    _Var2 = (__ireturn_type)
            std::
            _Hashtable<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,Node*>,std::allocator<std::pair<llvm::Instruction_const*const,Node*>>,std::__detail::_Select1st,std::equal_to<llvm::Instruction_const*>,std::hash<llvm::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<llvm::Instruction_const*,JoinNode*&>
                      ((_Hashtable<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,Node*>,std::allocator<std::pair<llvm::Instruction_const*const,Node*>>,std::__detail::_Select1st,std::equal_to<llvm::Instruction_const*>,std::hash<llvm::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->llvmToNodeMap_,&local_20,&local_28);
  }
  if (((undefined1  [16])_Var2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_28 = (JoinNode *)0x0;
  }
  return local_28;
}

Assistant:

JoinNode *GraphBuilder::addNode(JoinNode *node) {
    llvmToJoins_.emplace(node->callInstruction(), node);
    if (node->isArtificial()) {
        if (this->artificialNodes_.insert(node).second) {
            return node;
        }
    } else {
        if (this->llvmToNodeMap_.emplace(node->llvmInstruction(), node)
                    .second) {
            return node;
        }
    }

    return nullptr;
}